

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMovemRgEa<(moira::Instr)77,(moira::Mode)7,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  u32 addr;
  Moira *in_RDI;
  AEStackFrame frame;
  int i;
  u32 ea;
  u16 mask;
  int dst;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  undefined1 in_stack_ffffffffffffffd8 [16];
  undefined1 auVar4 [12];
  
  auVar4 = in_stack_ffffffffffffffd8._4_12_;
  uVar2 = readI<(moira::Size)2>
                    ((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  addr = computeEA<(moira::Mode)7,(moira::Size)4,0ul>
                   ((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (u32)((ulong)in_RDI >> 0x20));
  if (((short)uVar2 == 0) || (bVar1 = misaligned<(moira::Size)4>(in_RDI,addr), !bVar1)) {
    for (iVar3 = 0; iVar3 < 0x10; iVar3 = iVar3 + 1) {
      if ((uVar2 & 0xffff & 1 << ((byte)iVar3 & 0x1f)) != 0) {
        writeM<(moira::Mode)7,(moira::Size)4,0ul>
                  ((Moira *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),(u32)((ulong)in_RDI >> 0x20),
                   (u32)in_RDI);
      }
    }
    prefetch<4ul>((Moira *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
  }
  else {
    setFC<(moira::Mode)7>(in_RDI);
    iVar3 = (int)((ulong)in_RDI >> 0x20);
    frame = makeFrame<72ul>(auVar4._4_8_,auVar4._0_4_);
    execAddressError((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),frame,
                     iVar3);
  }
  return;
}

Assistant:

void
Moira::execMovemRgEa(u16 opcode)
{
    int dst  = _____________xxx(opcode);
    u16 mask = readI<Word>();

    switch (M) {

        case 4: // -(An)
        {
            u32 ea = readA(dst);
            
            // Check for address error
            if (mask && misaligned<S>(ea)) {
                setFC<M>();
                execAddressError(makeFrame <AE_INC_PC|AE_WRITE> (ea - S));
                return;
            }

            for(int i = 15; i >= 0; i--) {

                if (mask & (0x8000 >> i)) {
                    ea -= S;
                    writeM <M, S, MIMIC_MUSASHI ? REVERSE : 0> (ea, reg.r[i]);
                }
            }
            writeA(dst, ea);
            break;
        }
        default:
        {
            u32 ea = computeEA<M,S>(dst);
            
            // Check for address error
            if (mask && misaligned<S>(ea)) {
                setFC<M>();
                execAddressError(makeFrame <AE_INC_PC|AE_WRITE> (ea));
                return;
            }
  
            for(int i = 0; i < 16; i++) {
                
                if (mask & (1 << i)) {
                    writeM <M, S> (ea, reg.r[i]);
                    ea += S;
                }
            }
            break;
        }
    }
    prefetch<POLLIPL>();
}